

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MercatorTile.cpp
# Opt level: O0

vector<mercatortile::Tile,_std::allocator<mercatortile::Tile>_> *
mercatortile::children
          (vector<mercatortile::Tile,_std::allocator<mercatortile::Tile>_> *__return_storage_ptr__,
          Tile *tile)

{
  value_type local_58;
  value_type local_4c;
  value_type local_40 [2];
  value_type local_28;
  undefined1 local_19;
  Tile *local_18;
  Tile *tile_local;
  vector<mercatortile::Tile,_std::allocator<mercatortile::Tile>_> *return_tiles;
  
  local_19 = 0;
  local_18 = tile;
  tile_local = (Tile *)__return_storage_ptr__;
  std::vector<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>::vector
            (__return_storage_ptr__);
  local_28.x = local_18->x * 2;
  local_28.y = local_18->y * 2;
  local_28.z = local_18->z + 1;
  std::vector<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>::push_back
            (__return_storage_ptr__,&local_28);
  local_40[0].x = local_18->x * 2 + 1;
  local_40[0].y = local_18->y * 2;
  local_40[0].z = local_18->z + 1;
  std::vector<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>::push_back
            (__return_storage_ptr__,local_40);
  local_4c.x = local_18->x * 2;
  local_4c.y = local_18->y * 2 + 1;
  local_4c.z = local_18->z + 1;
  std::vector<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>::push_back
            (__return_storage_ptr__,&local_4c);
  local_58.x = local_18->x * 2 + 1;
  local_58.y = local_18->y * 2 + 1;
  local_58.z = local_18->z + 1;
  std::vector<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>::push_back
            (__return_storage_ptr__,&local_58);
  return __return_storage_ptr__;
}

Assistant:

vector<Tile> children(const Tile &tile)
{
    vector<Tile> return_tiles;
    return_tiles.push_back(Tile{tile.x * 2, tile.y * 2, tile.z + 1});
    return_tiles.push_back(Tile{tile.x * 2 + 1, tile.y * 2, tile.z + 1});
    return_tiles.push_back(Tile{tile.x * 2, tile.y * 2 + 1, tile.z + 1});
    return_tiles.push_back(Tile{tile.x * 2 + 1, tile.y * 2 + 1, tile.z + 1});

    return return_tiles;
}